

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.cpp
# Opt level: O1

int tinfl_decompress_mem_to_callback
              (void *pIn_buf,size_t *pIn_buf_size,tinfl_put_buf_func_ptr pPut_buf_func,
              void *pPut_buf_user,int flags)

{
  mz_uint8 *pOut_buf_next;
  bool bVar1;
  tinfl_status tVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  undefined1 local_2b70 [8];
  tinfl_decompressor decomp;
  size_t local_60;
  size_t in_buf_size;
  size_t dst_buf_size;
  mz_uint8 *local_48;
  ulong local_40;
  mz_uint32 local_34;
  
  decomp._10992_8_ = pIn_buf;
  dst_buf_size = (size_t)pIn_buf_size;
  local_48 = (mz_uint8 *)malloc(0x8000);
  if (local_48 == (mz_uint8 *)0x0) {
    iVar4 = -1;
  }
  else {
    local_2b70._0_4_ = 0;
    local_34 = flags & 0xfffffff9;
    local_40 = 0;
    lVar6 = 0;
    uVar5 = 0;
    do {
      local_60 = *(long *)dst_buf_size - lVar6;
      in_buf_size = 0x8000 - uVar5;
      pOut_buf_next = local_48 + uVar5;
      tVar2 = tinfl_decompress((tinfl_decompressor *)local_2b70,
                               (mz_uint8 *)(decomp._10992_8_ + lVar6),&local_60,local_48,
                               pOut_buf_next,&in_buf_size,local_34);
      lVar6 = lVar6 + local_60;
      iVar4 = (int)in_buf_size;
      if (in_buf_size == 0) {
LAB_0011ba32:
        if (tVar2 != TINFL_STATUS_HAS_MORE_OUTPUT) {
          local_40 = (ulong)(tVar2 == TINFL_STATUS_DONE);
          goto LAB_0011ba54;
        }
        uVar5 = (ulong)(iVar4 + (int)uVar5 & 0x7fff);
        bVar1 = true;
      }
      else {
        iVar3 = (*pPut_buf_func)(pOut_buf_next,iVar4,pPut_buf_user);
        if (iVar3 != 0) goto LAB_0011ba32;
LAB_0011ba54:
        bVar1 = false;
      }
    } while (bVar1);
    free(local_48);
    *(long *)dst_buf_size = lVar6;
    iVar4 = (int)local_40;
  }
  return iVar4;
}

Assistant:

int tinfl_decompress_mem_to_callback(const void *pIn_buf, size_t *pIn_buf_size,
    tinfl_put_buf_func_ptr pPut_buf_func, void *pPut_buf_user,
    int flags)
{
    int result = 0;
    tinfl_decompressor decomp;
    mz_uint8 *pDict = (mz_uint8*)MZ_MALLOC(TINFL_LZ_DICT_SIZE);
    size_t in_buf_ofs = 0, dict_ofs = 0;
    if (!pDict)
        return TINFL_STATUS_FAILED;
    tinfl_init(&decomp);
    for (;;)
    {
        size_t in_buf_size = *pIn_buf_size - in_buf_ofs,
               dst_buf_size = TINFL_LZ_DICT_SIZE - dict_ofs;
        tinfl_status status = tinfl_decompress(
                &decomp, (const mz_uint8*)pIn_buf + in_buf_ofs, &in_buf_size, pDict, pDict + dict_ofs,
                &dst_buf_size,
                (flags & ~(TINFL_FLAG_HAS_MORE_INPUT | TINFL_FLAG_USING_NON_WRAPPING_OUTPUT_BUF)));
        in_buf_ofs += in_buf_size;
        if ((dst_buf_size) &&
            (!(*pPut_buf_func)(pDict + dict_ofs, (int)dst_buf_size, pPut_buf_user)))
            break;
        if (status != TINFL_STATUS_HAS_MORE_OUTPUT)
        {
            result = (status == TINFL_STATUS_DONE);
            break;
        }
        dict_ofs = (dict_ofs + dst_buf_size) & (TINFL_LZ_DICT_SIZE - 1);
    }
    MZ_FREE(pDict);
    *pIn_buf_size = in_buf_ofs;
    return result;
}